

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLutility.c
# Opt level: O0

void RDL_print2DCharArray(char **arr,uint n,uint m)

{
  uint local_20;
  uint local_1c;
  uint j;
  uint i;
  uint m_local;
  uint n_local;
  char **arr_local;
  
  for (local_1c = 0; local_1c < n; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < m; local_20 = local_20 + 1) {
      printf("%d ",(ulong)(uint)(int)arr[local_1c][local_20]);
    }
    printf("\n");
  }
  return;
}

Assistant:

void RDL_print2DCharArray(char **arr, unsigned n, unsigned m)
{
  unsigned i,j;
  for(i=0; i<n; ++i)
  {
    for(j=0; j<m; ++j)
    {
      printf("%d ",arr[i][j]);
    }
    printf("\n");
  }
}